

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosYAML.cpp
# Opt level: O1

HostAccessProtocol adios2::helper::GetHostAccessProtocol(string *valueStr)

{
  size_type sVar1;
  pointer pcVar2;
  int iVar3;
  HostAccessProtocol HVar4;
  size_type sVar5;
  
  sVar1 = valueStr->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (valueStr->_M_dataplus)._M_p;
    sVar5 = 0;
    do {
      iVar3 = tolower((int)pcVar2[sVar5]);
      pcVar2[sVar5] = (char)iVar3;
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  iVar3 = std::__cxx11::string::compare((char *)valueStr);
  if (iVar3 == 0) {
    HVar4 = SSH;
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)valueStr);
    if (iVar3 == 0) {
      HVar4 = S3;
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)valueStr);
      HVar4 = (uint)(iVar3 == 0) * 2;
    }
  }
  return HVar4;
}

Assistant:

HostAccessProtocol GetHostAccessProtocol(std::string valueStr)
{
    std::transform(valueStr.begin(), valueStr.end(), valueStr.begin(), ::tolower);
    if (valueStr == "ssh")
    {
        return HostAccessProtocol::SSH;
    }
    else if (valueStr == "s3")
    {
        return HostAccessProtocol::S3;
    }
    else if (valueStr == "xrootd")
    {
        return HostAccessProtocol::XRootD;
    }
    return HostAccessProtocol::Invalid;
}